

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessIntersectList(Clipper *this)

{
  IntersectNode *pIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  ulong uVar4;
  
  ppIVar2 = (this->m_IntersectList).
            super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->m_IntersectList).
            super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar3 != ppIVar2) {
    uVar4 = 0;
    do {
      pIVar1 = ppIVar2[uVar4];
      IntersectEdges(this,pIVar1->Edge1,pIVar1->Edge2,&pIVar1->Pt);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 pIVar1->Edge1,pIVar1->Edge2);
      operator_delete(pIVar1,0x20);
      uVar4 = uVar4 + 1;
      ppIVar2 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar4 < (ulong)((long)ppIVar3 - (long)ppIVar2 >> 3));
  }
  if (ppIVar3 != ppIVar2) {
    (this->m_IntersectList).
    super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  }
  return;
}

Assistant:

void Clipper::ProcessIntersectList()
{
  for (size_t i = 0; i < m_IntersectList.size(); ++i)
  {
    IntersectNode* iNode = m_IntersectList[i];
    {
      IntersectEdges( iNode->Edge1, iNode->Edge2, iNode->Pt);
      SwapPositionsInAEL( iNode->Edge1 , iNode->Edge2 );
    }
    delete iNode;
  }
  m_IntersectList.clear();
}